

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O1

LY_ERR lyd_path_list_predicate
                 (lyd_node *node,char **buffer,size_t *buflen,size_t *bufused,ly_bool is_static)

{
  byte *pbVar1;
  bool bVar2;
  int iVar3;
  char *__s;
  size_t sVar4;
  size_t sVar5;
  char *pcVar6;
  LY_ERR LVar7;
  uint uVar8;
  long lVar9;
  ulong size;
  
  if ((node == (lyd_node *)0x0) ||
     ((node->schema != (lysc_node *)0x0 && ((node->schema->nodetype & 0x711) == 0)))) {
    lVar9 = 0;
  }
  else {
    lVar9._0_4_ = node[1].hash;
    lVar9._4_4_ = node[1].flags;
  }
  while( true ) {
    if (lVar9 == 0) {
      return LY_SUCCESS;
    }
    pbVar1 = *(byte **)(lVar9 + 8);
    if ((pbVar1 == (byte *)0x0) || ((pbVar1[3] & 1) == 0)) break;
    if ((*pbVar1 & 0xc) == 0) {
      __s = (char *)0x0;
    }
    else {
      __s = *(char **)(lVar9 + 0x38);
      if (__s == (char *)0x0) {
        __s = lyd_value_get_canonical
                        ((ly_ctx *)**(undefined8 **)(pbVar1 + 8),(lyd_value *)(lVar9 + 0x38));
      }
    }
    sVar4 = strlen(*(char **)(*(long *)(lVar9 + 8) + 0x28));
    sVar5 = strlen(__s);
    size = *bufused + sVar5 + sVar4 + 6;
    bVar2 = size <= *buflen;
    if (is_static == '\0' && !bVar2) {
      pcVar6 = (char *)ly_realloc(*buffer,size);
      *buffer = pcVar6;
      LVar7 = LY_SUCCESS;
      if (pcVar6 == (char *)0x0) {
        LVar7 = LY_EMEM;
        bVar2 = false;
      }
      else {
        *buflen = size;
        bVar2 = true;
      }
    }
    else {
      LVar7 = (uint)(*buflen < size) * 9;
    }
    if (!bVar2) {
      return LVar7;
    }
    pcVar6 = strchr(__s,0x27);
    uVar8 = (uint)(pcVar6 == (char *)0x0) * 5 + 0x22;
    iVar3 = sprintf(*buffer + *bufused,"[%s=%c%s%c]",*(undefined8 *)(*(long *)(lVar9 + 8) + 0x28),
                    (ulong)uVar8,__s,(ulong)uVar8);
    *bufused = *bufused + (long)iVar3;
    lVar9 = *(long *)(lVar9 + 0x18);
  }
  return LY_SUCCESS;
}

Assistant:

LY_ERR
lyd_path_list_predicate(const struct lyd_node *node, char **buffer, size_t *buflen, size_t *bufused, ly_bool is_static)
{
    const struct lyd_node *key;
    size_t len;
    const char *val;
    char quot;

    for (key = lyd_child(node); key && key->schema && (key->schema->flags & LYS_KEY); key = key->next) {
        val = lyd_get_value(key);
        len = 1 + strlen(key->schema->name) + 2 + strlen(val) + 2;
        LY_CHECK_RET(lyd_path_str_enlarge(buffer, buflen, *bufused + len, is_static));

        quot = '\'';
        if (strchr(val, '\'')) {
            quot = '"';
        }
        *bufused += sprintf(*buffer + *bufused, "[%s=%c%s%c]", key->schema->name, quot, val, quot);
    }

    return LY_SUCCESS;
}